

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O0

void err(errtype_t type,char *message,...)

{
  __va_list_tag *in_RCX;
  undefined8 in_RDX;
  int in_EDI;
  char *in_R8;
  undefined8 in_R9;
  va_list args;
  errtype_t type_00;
  
  type_00 = (errtype_t)((ulong)in_R9 >> 0x20);
  if (((eline != last_line) || (ecolumn != last_col)) || (last_lvl < in_EDI)) {
    if ((eline < 1) || (ecolumn < 1)) {
      fprintf(_stderr,"%s: ",efile);
    }
    else {
      fprintf(_stderr,"%s:%d:%d: ",efile,(ulong)(uint)eline,(ulong)(uint)ecolumn);
    }
    verr(type_00,in_R8,in_RCX,(int)((ulong)in_RDX >> 0x20));
  }
  return;
}

Assistant:

void err(errtype_t type, const char* message, ...)
{
    va_list args;
#ifdef NDEBUG
    /* The recursive parser can generate a new error at each recursion level */
    if (eline == last_line && ecolumn == last_col && (int)type <= last_lvl)
        return;
#endif


    if (eline > 0 && ecolumn > 0)
        fprintf(stderr, "%s:%d:%d: ", efile, eline, ecolumn);
    else
        fprintf(stderr, "%s: ", efile);
    va_start(args, message);
    verr(type, message, args, 0);
    va_end(args);
}